

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_ManDfsAll(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar3;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Vec_PtrAlloc(iVar1);
  pAVar3 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar3);
  pAVar3 = Aig_ManConst1(p);
  Vec_PtrPush(p_00,pAVar3);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    Aig_ManDfsAll_rec(p,pAVar3,p_00);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_24);
    iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar3);
    if (iVar1 == 0) {
      Vec_PtrPush(p_00,pAVar3);
    }
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Aig_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0xe6,"Vec_Ptr_t *Aig_ManDfsAll(Aig_Man_t *)");
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsAll( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsAll_rec( p, pObj, vNodes );
    Aig_ManForEachCi( p, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vNodes, pObj );
    assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}